

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::xoshiro256plus>(xoshiro256plus *r)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  result_type rVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = (r->S).r[0];
  uVar6 = (r->S).r[1];
  uVar3 = (r->S).r[2];
  uVar4 = (r->S).r[3];
  lVar7 = 0x1000000;
  rVar5 = 0;
  do {
    uVar8 = uVar6 << 0x11;
    uVar3 = uVar3 ^ uVar2;
    uVar4 = uVar4 ^ uVar6;
    uVar6 = uVar6 ^ uVar3;
    uVar2 = uVar2 ^ uVar4;
    uVar4 = uVar4 << 0x2d | uVar4 >> 0x13;
    uVar3 = uVar3 ^ uVar8;
    rVar5 = rVar5 + uVar2 + uVar4;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  (r->S).r[1] = uVar6;
  (r->S).r[0] = uVar2;
  (r->S).r[2] = uVar3;
  (r->S).r[3] = uVar4;
  lVar7 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar7 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar5;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}